

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O3

int getEndIslands(EndIsland *islands,int mc,uint64_t seed,int chunkX,int chunkZ)

{
  uint64_t h;
  uint64_t uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  float fVar16;
  
  if (mc < 0x15) {
    if (mc < 0x10) {
      return 0;
    }
    uVar15 = chunkX << 4;
    uVar7 = chunkZ << 4;
    uVar1 = getPopulationSeed(mc,seed,uVar15,uVar7);
    uVar2 = uVar1 ^ 0x5deece66d;
    do {
      uVar2 = uVar2 * 0x5deece66d + 0xb & 0xffffffffffff;
      uVar6 = uVar2 >> 0x11;
      iVar8 = (int)(uVar6 / 0xe) * -0xf + (int)(uVar6 / 0xe);
    } while (-1 < iVar8 + -0xe);
    if ((int)uVar6 + iVar8 != 0) {
      return 0;
    }
    lVar3 = uVar2 * 0x5deece66d + 0xb;
    islands->x = (uint)((ulong)lVar3 >> 0x2c) & 0xf | uVar15;
    lVar3 = lVar3 * 0x5deece66d + 0xb;
    islands->y = ((uint)((ulong)lVar3 >> 0x2c) & 0xf) + 0x37;
    lVar3 = lVar3 * 0x5deece66d + 0xb;
    islands->z = (uint)((ulong)lVar3 >> 0x2c) & 0xf | uVar7;
    uVar2 = lVar3 * 0x5deece66d + 0xb;
    if ((uVar2 & 0xc00000000000) == 0) {
      lVar3 = uVar2 * 0x5deece66d + 0xb;
      islands[1].x = (uint)((ulong)lVar3 >> 0x2c) & 0xf | uVar15;
      lVar3 = lVar3 * 0x5deece66d + 0xb;
      islands[1].y = ((uint)((ulong)lVar3 >> 0x2c) & 0xf) + 0x37;
      uVar2 = lVar3 * 0x5deece66d + 0xb;
      islands[1].z = (uint)(uVar2 >> 0x2c) & 0xf | uVar7;
      do {
        uVar2 = uVar2 * 0x5deece66d + 0xb & 0xffffffffffff;
        iVar8 = (int)(uVar2 >> 0x11);
        uVar7 = iVar8 + (int)((uVar2 >> 0x11) / 3) * -3;
      } while (-1 < (int)((uVar7 - iVar8) + -3));
      uVar7 = uVar7 | 4;
      fVar16 = (float)(int)uVar7;
      islands->r = uVar7;
      do {
        uVar2 = uVar2 * 0x5deece66d + 0xb;
        fVar16 = fVar16 - ((float)((uint)(uVar2 >> 0x2f) & 1) + 0.5);
      } while (0.5 < fVar16);
      do {
        uVar2 = uVar2 * 0x5deece66d + 0xb & 0xffffffffffff;
        iVar8 = (int)(uVar2 >> 0x11);
        uVar15 = iVar8 + (int)((uVar2 >> 0x11) / 3) * -3;
      } while (-1 < (int)((uVar15 - iVar8) + -3));
      iVar8 = 2;
      lVar3 = 0x1c;
    }
    else {
      do {
        uVar2 = uVar2 * 0x5deece66d + 0xb & 0xffffffffffff;
        iVar8 = (int)(uVar2 >> 0x11);
        uVar15 = iVar8 + (int)((uVar2 >> 0x11) / 3) * -3;
      } while (-1 < (int)((uVar15 - iVar8) + -3));
      iVar8 = 1;
      lVar3 = 0xc;
    }
  }
  else {
    uVar15 = chunkX << 4;
    uVar7 = chunkZ << 4;
    uVar1 = getPopulationSeed(mc,seed,uVar15,uVar7);
    if (mc == 0x15) {
      lVar3 = (uVar1 ^ 0x5deece66d) * 0x5deece66d + 0xb;
      if (0.071428575 <= (float)((uint)((ulong)lVar3 >> 0x18) & 0xffffff) * 5.9604645e-08) {
        return 0;
      }
      uVar2 = lVar3 * 0x5deece66d + 0xb;
      lVar3 = uVar2 * 0x5deece66d + 0xb;
      islands->x = (uint)((ulong)lVar3 >> 0x2c) & 0xf | uVar15;
      lVar3 = lVar3 * 0x5deece66d + 0xb;
      islands->z = (uint)((ulong)lVar3 >> 0x2c) & 0xf | uVar7;
      uVar6 = lVar3 * 0x5deece66d + 0xb;
      islands->y = ((uint)(uVar6 >> 0x2c) & 0xf) + 0x37;
      do {
        uVar6 = uVar6 * 0x5deece66d + 0xb & 0xffffffffffff;
        iVar8 = (int)(uVar6 >> 0x11);
        uVar12 = iVar8 + (int)((uVar6 >> 0x11) / 3) * -3;
      } while (-1 < (int)((uVar12 - iVar8) + -3));
      uVar12 = uVar12 | 4;
      fVar16 = (float)(int)uVar12;
      islands->r = uVar12;
      do {
        uVar6 = uVar6 * 0x5deece66d + 0xb;
        fVar16 = fVar16 - ((float)((uint)(uVar6 >> 0x2f) & 1) + 0.5);
      } while (0.5 < fVar16);
      if ((uVar2 & 0xc00000000000) != 0) {
        return 1;
      }
      lVar3 = uVar6 * 0x5deece66d + 0xb;
      islands[1].x = (uint)((ulong)lVar3 >> 0x2c) & 0xf | uVar15;
      lVar3 = lVar3 * 0x5deece66d + 0xb;
      islands[1].z = (uint)((ulong)lVar3 >> 0x2c) & 0xf | uVar7;
      uVar2 = lVar3 * 0x5deece66d + 0xb;
      islands[1].y = ((uint)(uVar2 >> 0x2c) & 0xf) + 0x37;
      do {
        uVar2 = uVar2 * 0x5deece66d + 0xb & 0xffffffffffff;
        iVar8 = (int)(uVar2 >> 0x11);
        uVar15 = iVar8 + (int)((uVar2 >> 0x11) / 3) * -3;
      } while (-1 < (int)((uVar15 - iVar8) + -3));
    }
    else {
      uVar2 = uVar1 ^ 0x6a09e667f3bcc909;
      uVar6 = (uVar2 >> 0x1e ^ uVar2) * -0x40a7b892e31b1a47;
      uVar2 = (uVar2 + 0x9e3779b97f4a7c15 >> 0x1e ^ uVar2 + 0x9e3779b97f4a7c15) *
              -0x40a7b892e31b1a47;
      uVar6 = (uVar6 >> 0x1b ^ uVar6) * -0x6b2fb644ecceee15;
      uVar10 = (uVar2 >> 0x1b ^ uVar2) * -0x6b2fb644ecceee15;
      uVar6 = uVar6 >> 0x1f ^ uVar6;
      uVar10 = uVar10 >> 0x1f ^ uVar10;
      uVar2 = uVar10 + uVar6;
      if (0.071428575 <=
          (float)(uint)((uVar2 * 0x20000 | uVar2 >> 0x2f) + uVar6 >> 0x28) * 5.9604645e-08) {
        return 0;
      }
      uVar10 = uVar10 ^ uVar6;
      uVar4 = uVar10 << 0x1c | uVar10 >> 0x24;
      uVar6 = (uVar6 << 0x31 | uVar6 >> 0xf) ^ uVar10;
      uVar5 = uVar10 << 0x15 ^ uVar6;
      uVar2 = uVar5 + uVar4;
      uVar4 = uVar4 ^ uVar5;
      uVar11 = uVar4 << 0x15 ^ (uVar6 << 0x31 | uVar5 >> 0xf) ^ uVar4;
      uVar10 = uVar4 << 0x1c | uVar4 >> 0x24;
      uVar6 = uVar11 + uVar10;
      uVar10 = uVar10 ^ uVar11;
      uVar13 = uVar10 << 0x15 ^ (uVar11 << 0x31 | uVar11 >> 0xf) ^ uVar10;
      uVar4 = uVar10 << 0x1c | uVar10 >> 0x24;
      uVar10 = uVar13 + uVar4;
      uVar4 = uVar4 ^ uVar13;
      islands->x = (uint)((uVar6 * 0x20000 | uVar6 >> 0x2f) + uVar11 >> 0x3c) | uVar15;
      uVar14 = uVar4 << 0x15 ^ (uVar13 << 0x31 | uVar13 >> 0xf) ^ uVar4;
      uVar4 = uVar4 << 0x1c | uVar4 >> 0x24;
      uVar6 = uVar14 + uVar4;
      uVar4 = uVar4 ^ uVar14;
      uVar11 = uVar4 << 0x15 ^ (uVar14 << 0x31 | uVar14 >> 0xf) ^ uVar4;
      uVar4 = uVar4 << 0x1c | uVar4 >> 0x24;
      islands->z = (uint)((uVar10 * 0x20000 | uVar10 >> 0x2f) + uVar13 >> 0x3c) | uVar7;
      islands->y = (uint)((uVar6 * 0x20000 | uVar6 >> 0x2f) + uVar14 >> 0x3c) + 0x37;
      do {
        uVar6 = ((uVar11 + uVar4) * 0x20000 | uVar11 + uVar4 >> 0x2f) + uVar11;
        uVar4 = uVar4 ^ uVar11;
        uVar11 = (uVar11 << 0x31 | uVar11 >> 0xf) ^ uVar4 << 0x15 ^ uVar4;
        uVar4 = uVar4 << 0x1c | uVar4 >> 0x24;
        uVar12 = (uint)(uVar6 >> 0x20);
        uVar9 = (uVar12 >> 1) + (int)(uVar6 / 0x600000000) * -3;
      } while (-1 < (int)((uVar9 - (uVar12 >> 1)) + -3));
      uVar9 = uVar9 | 4;
      islands->r = uVar9;
      if ((uint)((uVar2 * 0x20000 | uVar2 >> 0x2f) + uVar5 >> 0x3e) < 3) {
        return 1;
      }
      fVar16 = (float)(int)uVar9;
      do {
        lVar3 = ((uVar11 + uVar4) * 0x20000 | uVar11 + uVar4 >> 0x2f) + uVar11;
        uVar4 = uVar4 ^ uVar11;
        uVar11 = (uVar11 << 0x31 | uVar11 >> 0xf) ^ uVar4 << 0x15 ^ uVar4;
        uVar4 = uVar4 << 0x1c | uVar4 >> 0x24;
        fVar16 = fVar16 - ((float)(uint)((ulong)lVar3 >> 0x3f) + 0.5);
      } while (0.5 < fVar16);
      uVar2 = uVar4 ^ uVar11;
      uVar5 = uVar2 << 0x15 ^ (uVar11 << 0x31 | uVar11 >> 0xf) ^ uVar2;
      uVar6 = uVar2 << 0x1c | uVar2 >> 0x24;
      uVar2 = uVar5 + uVar6;
      uVar6 = uVar6 ^ uVar5;
      uVar13 = uVar6 << 0x15 ^ (uVar5 << 0x31 | uVar5 >> 0xf) ^ uVar6;
      uVar10 = uVar6 << 0x1c | uVar6 >> 0x24;
      islands[1].x = uVar15 | (uint)(((uVar11 + uVar4) * 0x20000 | uVar11 + uVar4 >> 0x2f) + uVar11
                                    >> 0x3c);
      uVar6 = uVar13 + uVar10;
      uVar10 = uVar10 ^ uVar13;
      uVar4 = uVar10 << 0x15 ^ (uVar13 << 0x31 | uVar13 >> 0xf) ^ uVar10;
      uVar10 = uVar10 << 0x1c | uVar10 >> 0x24;
      islands[1].z = uVar7 | (uint)((uVar2 * 0x20000 | uVar2 >> 0x2f) + uVar5 >> 0x3c);
      islands[1].y = (uint)((uVar6 * 0x20000 | uVar6 >> 0x2f) + uVar13 >> 0x3c) + 0x37;
      do {
        uVar2 = ((uVar4 + uVar10) * 0x20000 | uVar4 + uVar10 >> 0x2f) + uVar4;
        uVar10 = uVar10 ^ uVar4;
        uVar4 = uVar10 << 0x15 ^ (uVar4 << 0x31 | uVar4 >> 0xf) ^ uVar10;
        uVar10 = uVar10 << 0x1c | uVar10 >> 0x24;
        uVar7 = (uint)(uVar2 >> 0x21);
        uVar15 = uVar7 + (int)(uVar2 / 0x600000000) * -3;
      } while (-1 < (int)((uVar15 - uVar7) + -3));
    }
    iVar8 = 2;
    lVar3 = 0x1c;
  }
  *(uint *)((long)&islands->x + lVar3) = uVar15 | 4;
  return iVar8;
}

Assistant:

int getEndIslands(EndIsland islands[2], int mc, uint64_t seed, int chunkX, int chunkZ)
{
    StructureConfig sconf;
    if (!getStructureConfig(End_Island, mc, &sconf))
        return 0;

    int x = chunkX * 16;
    int z = chunkZ * 16;
    uint64_t rng = getPopulationSeed(mc, seed, x, z);
    Xoroshiro xr;
    float r;

    if (mc <= MC_1_16)
    {
        setSeed(&rng, rng + sconf.salt);
        if (nextInt(&rng, (int)sconf.rarity) != 0)
            return 0;
        islands[0].x = nextInt(&rng, 16) + x;
        islands[0].y = nextInt(&rng, 16) + 55;
        islands[0].z = nextInt(&rng, 16) + z;
        if (nextInt(&rng, 4) != 0)
        {
            islands[0].r = nextInt(&rng, 3) + 4;
            return 1;
        }
        islands[1].x = nextInt(&rng, 16) + x;
        islands[1].y = nextInt(&rng, 16) + 55;
        islands[1].z = nextInt(&rng, 16) + z;
        islands[0].r = nextInt(&rng, 3) + 4;
        for (r = islands[0].r; r > 0.5; r -= nextInt(&rng, 2) + 0.5);
        islands[1].r = nextInt(&rng, 3) + 4;
        return 2;
    }
    else if (mc <= MC_1_17)
    {
        setSeed(&rng, rng + sconf.salt);
        if (nextFloat(&rng) >= sconf.rarity)
            return 0;
        int second = nextInt(&rng, 4) == 0;
        islands[0].x = nextInt(&rng, 16) + x;
        islands[0].z = nextInt(&rng, 16) + z;
        islands[0].y = nextInt(&rng, 16) + 55;
        islands[0].r = nextInt(&rng, 3) + 4;
        for (r = islands[0].r; r > 0.5; r -= nextInt(&rng, 2) + 0.5);
        if (!second)
            return 1;
        islands[1].x = nextInt(&rng, 16) + x;
        islands[1].z = nextInt(&rng, 16) + z;
        islands[1].y = nextInt(&rng, 16) + 55;
        islands[1].r = nextInt(&rng, 3) + 4;
        return 2;
    }
    else
    {
        xSetSeed(&xr, rng + sconf.salt);
        if (xNextFloat(&xr) >= sconf.rarity)
            return 0;
        int second = (xNextIntJ(&xr, 4) == 3);
        islands[0].x = xNextIntJ(&xr, 16) + x;
        islands[0].z = xNextIntJ(&xr, 16) + z;
        islands[0].y = xNextIntJ(&xr, 16) + 55;
        islands[0].r = xNextIntJ(&xr, 3) + 4;
        if (!second)
            return 1;
        for (r = islands[0].r; r > 0.5; r -= xNextIntJ(&xr, 2) + 0.5);
        islands[1].x = xNextIntJ(&xr, 16) + x;
        islands[1].z = xNextIntJ(&xr, 16) + z;
        islands[1].y = xNextIntJ(&xr, 16) + 55;
        islands[1].r = xNextIntJ(&xr, 3) + 4;
        return 2;
    }
}